

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_HashFlag_Test::TestBody(FormatterTest_HashFlag_Test *this)

{
  bool bVar1;
  format_error *e_3;
  bool gtest_caught_expected_3;
  string gtest_expected_message_3;
  AssertionResult gtest_ar_34;
  format_error *e_2;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_33;
  format_error *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_32;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff110;
  char (*in_stack_fffffffffffff118) [10];
  char *in_stack_fffffffffffff120;
  undefined4 in_stack_fffffffffffff128;
  int in_stack_fffffffffffff12c;
  char *in_stack_fffffffffffff130;
  undefined4 in_stack_fffffffffffff138;
  Type in_stack_fffffffffffff13c;
  AssertionResult *in_stack_fffffffffffff140;
  char (*in_stack_fffffffffffff148) [7];
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffff188;
  undefined1 in_stack_fffffffffffff18f;
  allocator *in_stack_fffffffffffff190;
  string local_aa8 [38];
  byte local_a82;
  undefined1 local_a81 [33];
  AssertionResult local_a60 [3];
  string local_a30 [38];
  byte local_a0a;
  allocator local_a09;
  string local_a08 [32];
  AssertionResult local_9e8 [3];
  undefined1 local_9b1;
  string local_9b0 [38];
  byte local_98a;
  allocator local_989;
  string local_988 [32];
  AssertionResult local_968 [3];
  int local_938;
  undefined1 local_931;
  string local_930 [38];
  byte local_90a;
  allocator local_909;
  string local_908 [32];
  AssertionResult local_8e8 [2];
  longdouble local_8c8;
  string local_8b8 [32];
  AssertionResult local_898 [2];
  undefined8 local_878;
  string local_870 [32];
  AssertionResult local_850 [2];
  undefined8 local_830;
  string local_828 [32];
  AssertionResult local_808 [2];
  undefined8 local_7e8;
  string local_7e0 [32];
  AssertionResult local_7c0 [2];
  undefined8 local_7a0;
  string local_798 [32];
  AssertionResult local_778 [2];
  undefined8 local_758;
  string local_750 [32];
  AssertionResult local_730 [2];
  undefined8 local_710;
  string local_708 [32];
  AssertionResult local_6e8 [2];
  undefined8 local_6c8;
  string local_6c0 [32];
  AssertionResult local_6a0 [2];
  undefined8 local_680;
  string local_678 [32];
  AssertionResult local_658 [2];
  undefined8 local_638;
  string local_630 [32];
  AssertionResult local_610 [2];
  undefined8 local_5f0;
  string local_5e8 [32];
  AssertionResult local_5c8 [2];
  undefined8 local_5a8;
  string local_5a0 [32];
  AssertionResult local_580 [2];
  undefined8 local_560;
  string local_558 [32];
  AssertionResult local_538 [2];
  undefined8 local_518;
  string local_510 [32];
  AssertionResult local_4f0 [2];
  undefined8 local_4d0;
  string local_4c8 [32];
  AssertionResult local_4a8 [2];
  undefined8 local_488;
  string local_480 [32];
  AssertionResult local_460 [2];
  undefined8 local_440;
  string local_438 [32];
  AssertionResult local_418 [2];
  undefined8 local_3f8;
  string local_3f0 [32];
  AssertionResult local_3d0 [2];
  undefined4 local_3ac;
  string local_3a8 [32];
  AssertionResult local_388 [2];
  undefined4 local_364;
  string local_360 [32];
  AssertionResult local_340 [2];
  undefined4 local_31c;
  string local_318 [32];
  AssertionResult local_2f8 [2];
  undefined4 local_2d4;
  string local_2d0 [32];
  AssertionResult local_2b0 [2];
  undefined4 local_28c;
  string local_288 [32];
  AssertionResult local_268 [2];
  undefined4 local_244;
  string local_240 [32];
  AssertionResult local_220 [2];
  undefined4 local_1fc;
  string local_1f8 [32];
  AssertionResult local_1d8 [2];
  undefined4 local_1b4;
  string local_1b0 [32];
  AssertionResult local_190 [2];
  undefined4 local_16c;
  string local_168 [32];
  AssertionResult local_148 [2];
  undefined4 local_124;
  string local_120 [32];
  AssertionResult local_100 [2];
  undefined4 local_dc;
  string local_d8 [32];
  AssertionResult local_b8 [2];
  undefined4 local_94;
  string local_90 [32];
  AssertionResult local_70 [3];
  undefined4 local_3c;
  string local_38 [32];
  AssertionResult local_18;
  
  local_3c = 0x2a;
  fmt::v5::format<char[6],int>
            ((char (*) [6])in_stack_fffffffffffff148,(int *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [3])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x14799a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x1479fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x147a55);
  local_94 = 0xffffffd6;
  fmt::v5::format<char[6],int>
            ((char (*) [6])in_stack_fffffffffffff148,(int *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [4])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x147b52);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x147bb5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x147c0d);
  local_dc = 0x2a;
  fmt::v5::format<char[7],int>(in_stack_fffffffffffff148,(int *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [9])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x147d0a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x147d6d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x147dc5);
  local_124 = 0x2a;
  fmt::v5::format<char[7],int>(in_stack_fffffffffffff148,(int *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [9])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x147ec2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x147f25);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x147f7d);
  local_16c = 0xffffffd6;
  fmt::v5::format<char[7],int>(in_stack_fffffffffffff148,(int *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,in_stack_fffffffffffff118,in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_148);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x14807a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x1480dd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x148135);
  local_1b4 = 0x42;
  fmt::v5::format<char[7],int>(in_stack_fffffffffffff148,(int *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [5])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_190);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x148232);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x148295);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1482ed);
  local_1fc = 0x42;
  fmt::v5::format<char[7],int>(in_stack_fffffffffffff148,(int *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [5])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x1483ea);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x14844d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1484a5);
  local_244 = 0xffffffbe;
  fmt::v5::format<char[7],int>(in_stack_fffffffffffff148,(int *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [6])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_220);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x1485a2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x148605);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14865d);
  local_28c = 0x22;
  fmt::v5::format<char[7],int>(in_stack_fffffffffffff148,(int *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [4])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x14875a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x1487bd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x148815);
  local_2d4 = 0xffffffde;
  fmt::v5::format<char[7],int>(in_stack_fffffffffffff148,(int *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [5])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x148912);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x148975);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1489cd);
  local_31c = 0x2a;
  fmt::v5::format<char[6],unsigned_int>
            ((char (*) [6])in_stack_fffffffffffff148,(uint *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [3])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_318);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x148aca);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x148b2d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x148b85);
  local_364 = 0x42;
  fmt::v5::format<char[7],unsigned_int>(in_stack_fffffffffffff148,(uint *)in_stack_fffffffffffff140)
  ;
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [5])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_360);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_340);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x148c82);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x148ce5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x148d3d);
  local_3ac = 0x22;
  fmt::v5::format<char[7],unsigned_int>(in_stack_fffffffffffff148,(uint *)in_stack_fffffffffffff140)
  ;
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [4])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_3a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_388);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x148e3a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x148e9d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x148ef5);
  local_3f8 = 0xffffffffffffffd6;
  fmt::v5::format<char[6],long>
            ((char (*) [6])in_stack_fffffffffffff148,(long *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [4])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x148ff3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x149056);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1490ae);
  local_440 = 0x42;
  fmt::v5::format<char[7],long>(in_stack_fffffffffffff148,(long *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [5])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_438);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_418);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x1491ac);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x14920f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x149267);
  local_488 = 0xffffffffffffffbe;
  fmt::v5::format<char[7],long>(in_stack_fffffffffffff148,(long *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [6])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_480);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_460);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x149365);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x1493c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x149420);
  local_4d0 = 0x22;
  fmt::v5::format<char[7],long>(in_stack_fffffffffffff148,(long *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [4])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_4c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x14951e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x149581);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1495d9);
  local_518 = 0xffffffffffffffde;
  fmt::v5::format<char[7],long>(in_stack_fffffffffffff148,(long *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [5])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_510);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x1496d7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x14973a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x149792);
  local_560 = 0x2a;
  fmt::v5::format<char[6],unsigned_long>
            ((char (*) [6])in_stack_fffffffffffff148,(unsigned_long *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [3])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_558);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_538);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x149890);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x1498f3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14994b);
  local_5a8 = 0x42;
  fmt::v5::format<char[7],unsigned_long>
            (in_stack_fffffffffffff148,(unsigned_long *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [5])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_5a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_580);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x149a49);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x149aac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x149b04);
  local_5f0 = 0x22;
  fmt::v5::format<char[7],unsigned_long>
            (in_stack_fffffffffffff148,(unsigned_long *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [4])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_5e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x149c02);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x149c65);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x149cbd);
  local_638 = 0xffffffffffffffd6;
  fmt::v5::format<char[6],long_long>
            ((char (*) [6])in_stack_fffffffffffff148,(longlong *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [4])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_630);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_610);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x149dbb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x149e1e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x149e76);
  local_680 = 0x42;
  fmt::v5::format<char[7],long_long>
            (in_stack_fffffffffffff148,(longlong *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [5])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_678);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_658);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x149f74);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x149fd7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14a02f);
  local_6c8 = 0xffffffffffffffbe;
  fmt::v5::format<char[7],long_long>
            (in_stack_fffffffffffff148,(longlong *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [6])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_6c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x14a12d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x14a190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14a1e8);
  local_710 = 0x22;
  fmt::v5::format<char[7],long_long>
            (in_stack_fffffffffffff148,(longlong *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [4])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_708);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x14a2e6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x14a349);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14a3a1);
  local_758 = 0xffffffffffffffde;
  fmt::v5::format<char[7],long_long>
            (in_stack_fffffffffffff148,(longlong *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [5])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_730);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x14a49f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x14a502);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14a55a);
  local_7a0 = 0x2a;
  fmt::v5::format<char[6],unsigned_long_long>
            ((char (*) [6])in_stack_fffffffffffff148,(unsigned_long_long *)in_stack_fffffffffffff140
            );
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [3])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_798);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_778);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x14a658);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x14a6bb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14a713);
  local_7e8 = 0x42;
  fmt::v5::format<char[7],unsigned_long_long>
            (in_stack_fffffffffffff148,(unsigned_long_long *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [5])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_7e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x14a811);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x14a874);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14a8cc);
  local_830 = 0x22;
  fmt::v5::format<char[7],unsigned_long_long>
            (in_stack_fffffffffffff148,(unsigned_long_long *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [4])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_828);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_808);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x14a9ca);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x14aa2d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14aa85);
  local_878 = 0xc045000000000000;
  fmt::v5::format<char[6],double>
            ((char (*) [6])in_stack_fffffffffffff148,(double *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [9])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_850);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x14ab89);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x14abec);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14ac44);
  local_8c8 = (longdouble)-42.0;
  fmt::v5::format<char[6],long_double>
            ((char (*) [6])in_stack_fffffffffffff148,(longdouble *)in_stack_fffffffffffff140);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
             in_stack_fffffffffffff120,(char (*) [9])in_stack_fffffffffffff118,
             in_stack_fffffffffffff110);
  std::__cxx11::string::~string(local_8b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_898);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x14ad43);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x14ada6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14adfe);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8e8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_908,"missing \'}\' in format string",&local_909);
    std::allocator<char>::~allocator((allocator<char> *)&local_909);
    local_90a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_931 = 99;
      fmt::v5::format<char[5],char>
                ((char (*) [5])in_stack_fffffffffffff148,&in_stack_fffffffffffff140->success_);
      std::__cxx11::string::~string(local_930);
    }
    if ((local_90a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff140,
                 (char (*) [101])CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138));
      local_938 = 2;
    }
    else {
      local_938 = 0;
    }
    std::__cxx11::string::~string(local_908);
    if (local_938 != 0) goto LAB_0014b1a1;
  }
  else {
LAB_0014b1a1:
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x14b1bd);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x14b220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14b278);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_968);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_988,"invalid format specifier for char",&local_989);
    std::allocator<char>::~allocator((allocator<char> *)&local_989);
    local_98a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_9b1 = 99;
      fmt::v5::format<char[6],char>
                ((char (*) [6])in_stack_fffffffffffff148,&in_stack_fffffffffffff140->success_);
      std::__cxx11::string::~string(local_9b0);
    }
    if ((local_98a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff140,
                 (char (*) [102])CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138));
      local_938 = 3;
    }
    else {
      local_938 = 0;
    }
    std::__cxx11::string::~string(local_988);
    if (local_938 != 0) goto LAB_0014b61b;
  }
  else {
LAB_0014b61b:
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x14b637);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x14b69a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14b6f2);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_9e8);
  if (bVar1) {
    in_stack_fffffffffffff190 = &local_a09;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a08,"format specifier requires numeric argument",in_stack_fffffffffffff190);
    std::allocator<char>::~allocator((allocator<char> *)&local_a09);
    local_a0a = 0;
    in_stack_fffffffffffff18f = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff18f) {
      fmt::v5::format<char[6],char[4]>
                ((char (*) [6])in_stack_fffffffffffff148,&in_stack_fffffffffffff140->success_);
      std::__cxx11::string::~string(local_a30);
    }
    if ((local_a0a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff140,
                 (char (*) [104])CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138));
      local_938 = 4;
    }
    else {
      local_938 = 0;
    }
    std::__cxx11::string::~string(local_a08);
    if (local_938 != 0) goto LAB_0014ba6e;
  }
  else {
LAB_0014ba6e:
    testing::Message::Message((Message *)in_stack_fffffffffffff140);
    testing::AssertionResult::failure_message((AssertionResult *)0x14ba8a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
               in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff190,
               (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
    testing::Message::~Message((Message *)0x14bae7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14bb3f);
  this_00 = local_a60;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (bVar1) {
    in_stack_fffffffffffff140 = (AssertionResult *)local_a81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_a81 + 1),"format specifier requires numeric argument",
               (allocator *)in_stack_fffffffffffff140);
    std::allocator<char>::~allocator((allocator<char> *)local_a81);
    local_a82 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffff13c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff13c);
    if (bVar1) {
      fmt::v5::format<char[6],void*>(&this_00->success_,(void **)in_stack_fffffffffffff140);
      std::__cxx11::string::~string(local_aa8);
    }
    if ((local_a82 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff140,
                 (char (*) [128])CONCAT44(in_stack_fffffffffffff13c,in_stack_fffffffffffff138));
      local_938 = 5;
    }
    else {
      local_938 = 0;
    }
    std::__cxx11::string::~string((string *)(local_a81 + 1));
    if (local_938 == 0) goto LAB_0014bf69;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffff140);
  testing::AssertionResult::failure_message((AssertionResult *)0x14bec6);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffff140,in_stack_fffffffffffff13c,
             in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff120);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_fffffffffffff190,
             (Message *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff110);
  testing::Message::~Message((Message *)0x14bf21);
LAB_0014bf69:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14bf76);
  return;
}

Assistant:

TEST(FormatterTest, HashFlag) {
  EXPECT_EQ("42", format("{0:#}", 42));
  EXPECT_EQ("-42", format("{0:#}", -42));
  EXPECT_EQ("0b101010", format("{0:#b}", 42));
  EXPECT_EQ("0B101010", format("{0:#B}", 42));
  EXPECT_EQ("-0b101010", format("{0:#b}", -42));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42));
  EXPECT_EQ("0X42", format("{0:#X}", 0x42));
  EXPECT_EQ("-0x42", format("{0:#x}", -0x42));
  EXPECT_EQ("042", format("{0:#o}", 042));
  EXPECT_EQ("-042", format("{0:#o}", -042));
  EXPECT_EQ("42", format("{0:#}", 42u));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42u));
  EXPECT_EQ("042", format("{0:#o}", 042u));

  EXPECT_EQ("-42", format("{0:#}", -42l));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42l));
  EXPECT_EQ("-0x42", format("{0:#x}", -0x42l));
  EXPECT_EQ("042", format("{0:#o}", 042l));
  EXPECT_EQ("-042", format("{0:#o}", -042l));
  EXPECT_EQ("42", format("{0:#}", 42ul));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42ul));
  EXPECT_EQ("042", format("{0:#o}", 042ul));

  EXPECT_EQ("-42", format("{0:#}", -42ll));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42ll));
  EXPECT_EQ("-0x42", format("{0:#x}", -0x42ll));
  EXPECT_EQ("042", format("{0:#o}", 042ll));
  EXPECT_EQ("-042", format("{0:#o}", -042ll));
  EXPECT_EQ("42", format("{0:#}", 42ull));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42ull));
  EXPECT_EQ("042", format("{0:#o}", 042ull));

  if (FMT_USE_GRISU)
    EXPECT_EQ("-42.0", format("{0:#}", -42.0));
  else
    EXPECT_EQ("-42.0000", format("{0:#}", -42.0));
  EXPECT_EQ("-42.0000", format("{0:#}", -42.0l));
  EXPECT_THROW_MSG(format("{0:#", 'c'),
      format_error, "missing '}' in format string");
  EXPECT_THROW_MSG(format("{0:#}", 'c'),
      format_error, "invalid format specifier for char");
  EXPECT_THROW_MSG(format("{0:#}", "abc"),
      format_error, "format specifier requires numeric argument");
  EXPECT_THROW_MSG(format("{0:#}", reinterpret_cast<void*>(0x42)),
      format_error, "format specifier requires numeric argument");
}